

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1-cxx.cpp
# Opt level: O2

tuple<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_bool> * __thiscall
Secp256K1::Sign(tuple<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_bool>
                *__return_storage_ptr__,Secp256K1 *this,uint8_t *hash)

{
  int iVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sigOut;
  size_t sigOutSize;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  secp256k1_ecdsa_signature sig;
  
  iVar1 = secp256k1_ecdsa_sign
                    (this->ctx,&sig,hash,
                     (this->privKey).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,nonce_function_rfc6979,(void *)0x0);
  if (iVar1 == 1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&sigOut,0x48,(allocator_type *)&local_78);
    sigOutSize = 0x48;
    iVar1 = secp256k1_ecdsa_signature_serialize_der
                      (this->ctx,
                       sigOut.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,&sigOutSize,&sig);
    if (iVar1 == 1) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&sigOut,sigOutSize);
      (__return_storage_ptr__->
      super__Tuple_impl<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_bool>).
      super__Tuple_impl<1UL,_bool>.super__Head_base<1UL,_bool,_false>._M_head_impl = true;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&(__return_storage_ptr__->
                  super__Tuple_impl<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_bool>
                  ).
                  super__Head_base<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false>
                  ._M_head_impl,&sigOut);
    }
    else {
      (__return_storage_ptr__->
      super__Tuple_impl<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_bool>).
      super__Tuple_impl<1UL,_bool>.super__Head_base<1UL,_bool,_false>._M_head_impl = false;
      (__return_storage_ptr__->
      super__Tuple_impl<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_bool>).
      super__Head_base<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false>.
      _M_head_impl.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Tuple_impl<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_bool>).
      super__Head_base<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false>.
      _M_head_impl.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super__Tuple_impl<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_bool>).
      super__Head_base<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false>.
      _M_head_impl.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_78);
    }
  }
  else {
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_bool>).
    super__Tuple_impl<1UL,_bool>.super__Head_base<1UL,_bool,_false>._M_head_impl = false;
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_bool>).
    super__Head_base<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false>.
    _M_head_impl.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_bool>).
    super__Head_base<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false>.
    _M_head_impl.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_bool>).
    super__Head_base<0UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false>.
    _M_head_impl.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    sigOut.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    sigOut.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    sigOut.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&sigOut.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return __return_storage_ptr__;
}

Assistant:

std::tuple<std::vector<uint8_t>, bool> Secp256K1::Sign(
    const uint8_t* hash) const
{
    // Make signature.
    secp256k1_ecdsa_signature sig;
    int ret = secp256k1_ecdsa_sign(ctx, &sig, hash, privKey.data(),
        secp256k1_nonce_function_rfc6979, nullptr);
    if (ret != 1) {
        // Failed to sign.
        return std::make_tuple(std::vector<uint8_t>(), false);
    }

    // Serialize signature.
    std::vector<uint8_t> sigOut(72);
    size_t sigOutSize = 72;
    ret = secp256k1_ecdsa_signature_serialize_der(
        ctx, &sigOut[0], &sigOutSize, &sig);
    if (ret != 1) {
        // Failed to serialize.
        return std::make_tuple(std::vector<uint8_t>(), false);
    }

    // Returns
    sigOut.resize(sigOutSize);
    return std::make_tuple(sigOut, true);
}